

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_xi_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar28 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  auVar28._8_56_ = in_register_00001248;
  auVar28._0_8_ = eta;
  auVar26._8_56_ = in_register_00001208;
  auVar26._0_8_ = xi;
  auVar19 = ZEXT816(0x4008000000000000);
  auVar27 = auVar28._0_16_;
  auVar18 = vfmadd213sd_fma(auVar27,auVar27,auVar27);
  auVar24 = auVar26._0_16_;
  auVar16 = vmulsd_avx512f(auVar24,auVar19);
  dVar5 = zeta + -1.0;
  dVar6 = eta + -1.0;
  auVar17 = vfmadd213sd_avx512f(auVar19,auVar24,ZEXT816(0x3ff0000000000000));
  dVar7 = xi + -1.0;
  auVar9 = vfmadd213sd_fma(auVar19,auVar24,ZEXT816(0xbff0000000000000));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar16,auVar24);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar5;
  auVar19 = vmulsd_avx512f(auVar29,ZEXT816(0x3fb0000000000000));
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar6;
  auVar20 = vmulsd_avx512f(auVar32,auVar19);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = zeta;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = zeta;
  auVar10 = vfmadd231sd_fma(auVar18,auVar11,auVar12);
  dVar8 = auVar10._0_8_ + zeta + -3.0;
  auVar36 = ZEXT816(0x3fa0000000000000);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0] = dVar8 * auVar20._0_8_;
  dVar37 = auVar17._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[1] = dVar6 * dVar5 * dVar7 * dVar37 * this->m_lenX * 0.03125;
  auVar21 = vaddsd_avx512f(auVar27,ZEXT816(0x3ff0000000000000));
  auVar18 = vfmsub213sd_fma(auVar27,auVar27,auVar27);
  auVar20 = vmulsd_avx512f(auVar21,auVar19);
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar16,auVar24);
  auVar13._8_8_ = in_XMM2_Qb;
  auVar13._0_8_ = zeta;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = zeta;
  auVar19 = vfmadd231sd_fma(auVar18,auVar13,auVar14);
  dVar35 = auVar21._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[2] = this->m_lenY * 0.03125 * dVar35 * dVar6 * dVar6 * dVar5;
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = zeta;
  auVar22 = vaddsd_avx512f(auVar15,ZEXT816(0x3ff0000000000000));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->m_lenZ;
  auVar18 = vmulsd_avx512f(auVar36,auVar18);
  dVar39 = auVar22._0_8_;
  auVar18 = vmulsd_avx512f(auVar22,auVar18);
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar5;
  auVar18 = vmulsd_avx512f(auVar30,auVar18);
  auVar18 = vmulsd_avx512f(auVar32,auVar18);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar18 = vmulsd_avx512f(auVar30,ZEXT816(0xbfb0000000000000));
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar6;
  auVar16 = vmulsd_avx512f(auVar33,auVar18);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar8;
  auVar16 = vmulsd_avx512f(auVar16,auVar41);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[4] = auVar16._0_8_;
  auVar23 = vaddsd_avx512f(auVar24,ZEXT816(0x3ff0000000000000));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = this->m_lenX;
  auVar16 = vmulsd_avx512f(auVar36,auVar16);
  dVar8 = (auVar19._0_8_ - zeta) + -3.0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar19._0_8_ + zeta + -3.0;
  auVar24 = vmulsd_avx512f(auVar20,auVar25);
  auVar16 = vmulsd_avx512f(auVar23,auVar16);
  auVar16 = vmulsd_avx512f(auVar9,auVar16);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[5] = auVar16._0_8_ * dVar5 * dVar6;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->m_lenY;
  auVar16 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar19);
  auVar16 = vmulsd_avx512f(auVar21,auVar16);
  auVar16 = vmulsd_avx512f(auVar33,auVar16);
  auVar16 = vmulsd_avx512f(auVar33,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->m_lenZ;
  auVar16 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar20);
  auVar16 = vmulsd_avx512f(auVar22,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  auVar16 = vmulsd_avx512f(auVar33,auVar16);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 8;
  vmovsd_avx512f(auVar24);
  *pdVar1 = *pdVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = this->m_lenX;
  auVar19 = ZEXT816(0xbfa0000000000000);
  auVar16 = vmulsd_avx512f(auVar19,auVar24);
  auVar16 = vmulsd_avx512f(auVar23,auVar16);
  auVar16 = vmulsd_avx512f(auVar9,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  auVar16 = vmulsd_avx512f(auVar21,auVar16);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 9;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = this->m_lenY;
  auVar16 = vmulsd_avx512f(auVar19,auVar27);
  auVar16 = vmulsd_avx512f(auVar33,auVar16);
  auVar16 = vmulsd_avx512f(auVar21,auVar16);
  auVar16 = vmulsd_avx512f(auVar21,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 10;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_lenZ;
  auVar16 = vmulsd_avx512f(auVar36,auVar2);
  auVar16 = vmulsd_avx512f(auVar22,auVar16);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar5;
  auVar16 = vmulsd_avx512f(auVar31,auVar16);
  auVar16 = vmulsd_avx512f(auVar21,auVar16);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0xb;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  auVar18 = vmulsd_avx512f(auVar21,auVar18);
  auVar18 = vmulsd_avx512f(auVar18,auVar25);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar39 * 0.0625;
  auVar16 = vmulsd_avx512f(auVar33,auVar40);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xc] = auVar18._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_lenX;
  auVar18 = vmulsd_avx512f(auVar19,auVar3);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xd] = dVar35 * dVar5 * dVar7 * dVar37 * auVar18._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xe] = dVar5 * dVar35 * dVar35 * dVar6 * this->m_lenY * 0.03125;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_lenZ;
  auVar18 = vmulsd_avx512f(auVar19,auVar4);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xf] = dVar35 * dVar5 * dVar5 * dVar39 * auVar18._0_8_;
  auVar18 = vmulsd_avx512f(auVar22,ZEXT816(0xbfb0000000000000));
  auVar19 = vmulsd_avx512f(auVar33,auVar18);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = (auVar10._0_8_ - zeta) + -3.0;
  auVar19 = vmulsd_avx512f(auVar19,auVar42);
  auVar16 = vmulsd_avx512f(auVar16,auVar42);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x10;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_lenX;
  auVar20 = ZEXT816(0xbfa0000000000000);
  auVar19 = vmulsd_avx512f(auVar20,auVar10);
  auVar19 = vmulsd_avx512f(auVar17,auVar19);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar7;
  auVar19 = vmulsd_avx512f(auVar38,auVar19);
  auVar19 = vmulsd_avx512f(auVar22,auVar19);
  auVar19 = vmulsd_avx512f(auVar33,auVar19);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x11;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenY;
  auVar19 = vmulsd_avx512f(auVar20,auVar17);
  auVar19 = vmulsd_avx512f(auVar21,auVar19);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar6;
  auVar19 = vmulsd_avx512f(auVar34,auVar19);
  auVar19 = vmulsd_avx512f(auVar34,auVar19);
  auVar19 = vmulsd_avx512f(auVar22,auVar19);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x12;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->m_lenZ;
  auVar19 = vmulsd_avx512f(auVar36,auVar21);
  auVar19 = vmulsd_avx512f(auVar31,auVar19);
  auVar19 = vmulsd_avx512f(auVar22,auVar19);
  auVar19 = vmulsd_avx512f(auVar22,auVar19);
  auVar19 = vmulsd_avx512f(auVar34,auVar19);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0x13;
  vmovsd_avx512f(auVar19);
  *pdVar1 = *pdVar1;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x14] = auVar16._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->m_lenX;
  auVar16 = vmulsd_avx512f(auVar20,auVar22);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x15] = dVar39 * auVar9._0_8_ * auVar23._0_8_ * auVar16._0_8_ * dVar6;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x16] = dVar39 * this->m_lenY * 0.03125 * dVar35 * dVar6 * dVar6;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = this->m_lenZ;
  auVar16 = vmulsd_avx512f(auVar20,auVar36);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x17] = dVar39 * dVar39 * auVar16._0_8_ * dVar5 * dVar6;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x18] = dVar35 * auVar18._0_8_ * dVar8;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x19] = dVar35 * dVar39 * auVar9._0_8_ * auVar23._0_8_ * this->m_lenX * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1a] = dVar39 * dVar35 * dVar35 * dVar6 * this->m_lenY * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1b] = dVar35 * dVar39 * dVar39 * dVar5 * this->m_lenZ * 0.03125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1c] = dVar39 * 0.0625 * dVar35 * dVar8;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1d] = dVar35 * dVar39 * dVar7 * dVar37 * this->m_lenX * 0.03125;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenY;
  auVar18 = vmulsd_avx512f(auVar20,auVar9);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1e] = dVar39 * dVar35 * dVar35 * dVar6 * auVar18._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = this->m_lenZ;
  auVar18 = vmulsd_avx512f(auVar20,auVar23);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1f] = dVar35 * dVar39 * dVar39 * dVar5 * auVar18._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact, double xi, double eta, double zeta) {
    Sxi_xi_compact(0) = 0.0625 * (zeta - 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(1) = 0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(2) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1);
    Sxi_xi_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(4) = -0.0625 * (zeta - 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(5) = 0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(6) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1);
    Sxi_xi_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta - 1);
    Sxi_xi_compact(8) = 0.0625 * (zeta - 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(9) = -0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(10) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1);
    Sxi_xi_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(12) = -0.0625 * (zeta - 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta + zeta - 3);
    Sxi_xi_compact(13) = -0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(14) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1);
    Sxi_xi_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (eta + 1);
    Sxi_xi_compact(16) = -0.0625 * (zeta + 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(17) = -0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(18) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1);
    Sxi_xi_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(20) = 0.0625 * (zeta + 1) * (eta - 1) * (eta * eta + eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(21) = -0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(22) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1);
    Sxi_xi_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta - 1);
    Sxi_xi_compact(24) = -0.0625 * (zeta + 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(25) = 0.03125 * m_lenX * (xi + 1) * (3 * xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(26) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1);
    Sxi_xi_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(28) = 0.0625 * (zeta + 1) * (eta + 1) * (eta * eta - eta + 3 * xi * xi + zeta * zeta - zeta - 3);
    Sxi_xi_compact(29) = 0.03125 * m_lenX * (3 * xi + 1) * (xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_xi_compact(30) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1);
    Sxi_xi_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (eta + 1);
}